

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myHashMap.h
# Opt level: O1

wallet * __thiscall myHashMap<wallet>::getData(myHashMap<wallet> *this,myString *key)

{
  wallet *this_00;
  myBucket_chain<wallet> *pmVar1;
  l_node<myBucket<wallet>_> *plVar2;
  bool bVar3;
  uint uVar4;
  l_node<myBucket<wallet>_> **pplVar5;
  myString mStack_38;
  
  uVar4 = (*this->hashFunc)(key,this->tableSize);
  pmVar1 = this->table;
  myString::myString(&mStack_38,key);
  pplVar5 = &pmVar1[(int)uVar4].myBucketList.head;
  do {
    plVar2 = *pplVar5;
    this_00 = &(plVar2->data)._data;
    bVar3 = wallet::operator==(this_00,&mStack_38);
    pplVar5 = &plVar2->next;
  } while (!bVar3);
  myString::~myString(&mStack_38);
  return this_00;
}

Assistant:

T* getData(myString key) {
        int indexHash = hashFunc(key,this->tableSize);

        return this->table[indexHash].getData(key);

    }